

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.c
# Opt level: O3

int __thiscall CSQLInterface::Update(CSQLInterface *this,char *pquery,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  TString tquery;
  TString query;
  __va_list_tag local_10f8;
  undefined1 local_10d8 [16];
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  TString local_1020;
  TString local_818;
  
  if (in_AL != '\0') {
    local_10a8 = in_XMM0_Qa;
    local_1098 = in_XMM1_Qa;
    local_1088 = in_XMM2_Qa;
    local_1078 = in_XMM3_Qa;
    local_1068 = in_XMM4_Qa;
    local_1058 = in_XMM5_Qa;
    local_1048 = in_XMM6_Qa;
    local_1038 = in_XMM7_Qa;
  }
  local_10c8 = in_RDX;
  local_10c0 = in_RCX;
  local_10b8 = in_R8;
  local_10b0 = in_R9;
  TString::TString(&local_818);
  TString::TString(&local_1020);
  local_10f8.reg_save_area = local_10d8;
  local_10f8.overflow_arg_area = &arglist[0].overflow_arg_area;
  local_10f8.gp_offset = 0x10;
  local_10f8.fp_offset = 0x30;
  TString::Format(&local_818,&local_10f8,pquery);
  TString::operator=(&local_1020,"UPDATE ");
  pcVar2 = TString::operator_cast_to_char_(&local_818);
  TString::operator+=(&local_1020,pcVar2);
  pcVar2 = TString::operator_cast_to_char_(&local_1020);
  iVar1 = IQuery(this,pcVar2);
  TString::~TString(&local_1020);
  TString::~TString(&local_818);
  return iVar1;
}

Assistant:

int CSQLInterface::Update(const char *pquery, ...)
{
	TString query, tquery;

	MUNCH_VARARG(pquery, query)

	tquery = "UPDATE ";
	tquery += (const char *)query;
	return IQuery(tquery);
}